

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

int stumpless_trace_entry
              (stumpless_target *target,stumpless_entry_conflict *entry,char *file,int line,
              char *func)

{
  ulong uVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  char digits [50];
  
  if (entry == (stumpless_entry_conflict *)0x0) {
    pcVar4 = "entry was NULL";
  }
  else {
    uVar1 = (ulong)(uint)line;
    if (file == (char *)0x0) {
      pcVar4 = "file was NULL";
    }
    else {
      if (func != (char *)0x0) {
        digits[0x31] = '\0';
        if (line == 0) {
          pcVar4 = digits + 0x30;
          digits[0x30] = '0';
        }
        else {
          pcVar4 = digits + 0x31;
          while (iVar3 = (int)uVar1, iVar3 != 0) {
            pcVar4[-1] = (char)(iVar3 % 10) + '0';
            pcVar4 = pcVar4 + -1;
            uVar1 = (long)iVar3 / 10;
          }
        }
        stumpless_set_entry_param_value_by_name((stumpless_entry *)entry,"trace","file",file);
        _Var2 = stumpless_has_error();
        if (_Var2) {
          return -1;
        }
        stumpless_set_entry_param_value_by_name((stumpless_entry *)entry,"trace","line",pcVar4);
        _Var2 = stumpless_has_error();
        if (_Var2) {
          return -1;
        }
        stumpless_set_entry_param_value_by_name((stumpless_entry *)entry,"trace","function",func);
        _Var2 = stumpless_has_error();
        if (_Var2) {
          return -1;
        }
        iVar3 = stumpless_add_entry(target,entry);
        return iVar3;
      }
      pcVar4 = "func was NULL";
    }
  }
  raise_argument_empty(pcVar4);
  return -1;
}

Assistant:

int
stumpless_trace_entry( struct stumpless_target *target,
                       struct stumpless_entry *entry,
                       const char *file,
                       int line,
                       const char *func ) {
  char digits[MAX_INT_SIZE];
  char *line_str;

  VALIDATE_ARG_NOT_NULL_INT_RETURN( entry );
  VALIDATE_ARG_NOT_NULL_INT_RETURN( file );
  VALIDATE_ARG_NOT_NULL_INT_RETURN( func );

  digits[MAX_INT_SIZE-1] = '\0';
  line_str = digits + MAX_INT_SIZE - 1;
  if( line == 0 ) {
    line_str--;
    *line_str = '0';
  } else {
    while( line != 0 ) {
      line_str--;
      *line_str = ( line % 10 ) + 48;
      line /= 10;
    }
  }

  stumpless_set_entry_param_value_by_name( entry, "trace", "file", file );
  if( unlikely( stumpless_has_error(  ) ) ) {
    return -1;
  }

  stumpless_set_entry_param_value_by_name( entry, "trace", "line", line_str );
  if( unlikely( stumpless_has_error(  ) ) ) {
    return -1;
  }

  stumpless_set_entry_param_value_by_name( entry, "trace", "function", func );
  if( unlikely( stumpless_has_error(  ) ) ) {
    return -1;
  }

  return stumpless_add_entry( target, entry );
}